

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndObject(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
            *this,Context *context,SizeType memberCount)

{
  ISchemaValidator *pIVar1;
  int iVar2;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  Property *pPVar7;
  
  if (this->hasRequired_ == true) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x14])();
    if (this->propertyCount_ != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pPVar7 = this->properties_;
        if ((((&pPVar7->required)[lVar6] == true) && (context->propertyExist[uVar5] == false)) &&
           (*(int *)(*(long *)((long)&pPVar7->schema + lVar6) + 0x19c) == 0)) {
          (*context->error_handler->_vptr_IValidationErrorHandler[0x15])
                    (context->error_handler,(long)&(pPVar7->name).data_ + lVar6);
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x38;
      } while (uVar5 < this->propertyCount_);
    }
    iVar2 = (*context->error_handler->_vptr_IValidationErrorHandler[0x16])();
    if ((char)iVar2 != '\0') {
      context->invalidCode = kValidateErrorRequired;
      this_00 = GetRequiredString();
      goto LAB_0012f650;
    }
  }
  if (memberCount < this->minProperties_) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x13])
              (context->error_handler,(ulong)memberCount);
    context->invalidCode = kValidateErrorMinProperties;
    this_00 = GetMinPropertiesString();
  }
  else if (this->maxProperties_ < memberCount) {
    (*context->error_handler->_vptr_IValidationErrorHandler[0x12])
              (context->error_handler,(ulong)memberCount);
    context->invalidCode = kValidateErrorMaxProperties;
    this_00 = GetMaxPropertiesString();
  }
  else {
    if (this->hasDependencies_ != true) {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x19])();
    if (this->propertyCount_ != 0) {
      uVar5 = 0;
      do {
        if (context->propertyExist[uVar5] == true) {
          pPVar7 = this->properties_ + uVar5;
          if (pPVar7->dependencies == (bool *)0x0) {
            if (pPVar7->dependenciesSchema != (SchemaType *)0x0) {
              pIVar1 = context->validators[pPVar7->dependenciesValidatorIndex];
              iVar2 = (*pIVar1->_vptr_ISchemaValidator[2])(pIVar1);
              if ((char)iVar2 == '\0') {
                (*context->error_handler->_vptr_IValidationErrorHandler[0x1d])
                          (context->error_handler,pPVar7,pIVar1);
              }
            }
          }
          else {
            (*context->error_handler->_vptr_IValidationErrorHandler[0x1a])();
            if (this->propertyCount_ != 0) {
              lVar6 = 0;
              uVar4 = 0;
              do {
                if ((pPVar7->dependencies[uVar4] == true) &&
                   (context->propertyExist[uVar4] == false)) {
                  (*context->error_handler->_vptr_IValidationErrorHandler[0x1b])
                            (context->error_handler,(long)&(this->properties_->name).data_ + lVar6);
                }
                uVar4 = uVar4 + 1;
                lVar6 = lVar6 + 0x38;
              } while (uVar4 < this->propertyCount_);
            }
            (*context->error_handler->_vptr_IValidationErrorHandler[0x1c])
                      (context->error_handler,pPVar7);
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < this->propertyCount_);
    }
    iVar2 = (*context->error_handler->_vptr_IValidationErrorHandler[0x1e])();
    if ((char)iVar2 == '\0') {
      return true;
    }
    context->invalidCode = kValidateErrorDependencies;
    this_00 = GetDependenciesString();
  }
LAB_0012f650:
  pCVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar3;
  return false;
}

Assistant:

bool EndObject(Context& context, SizeType memberCount) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndObject");
        if (hasRequired_) {
            context.error_handler.StartMissingProperties();
            for (SizeType index = 0; index < propertyCount_; index++)
                if (properties_[index].required && !context.propertyExist[index])
                    if (properties_[index].schema->defaultValueLength_ == 0 )
                        context.error_handler.AddMissingProperty(properties_[index].name);
            if (context.error_handler.EndMissingProperties())
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorRequired);
        }

        if (memberCount < minProperties_) {
            context.error_handler.TooFewProperties(memberCount, minProperties_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMinProperties);
        }

        if (memberCount > maxProperties_) {
            context.error_handler.TooManyProperties(memberCount, maxProperties_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorMaxProperties);
        }

        if (hasDependencies_) {
            context.error_handler.StartDependencyErrors();
            for (SizeType sourceIndex = 0; sourceIndex < propertyCount_; sourceIndex++) {
                const Property& source = properties_[sourceIndex];
                if (context.propertyExist[sourceIndex]) {
                    if (source.dependencies) {
                        context.error_handler.StartMissingDependentProperties();
                        for (SizeType targetIndex = 0; targetIndex < propertyCount_; targetIndex++)
                            if (source.dependencies[targetIndex] && !context.propertyExist[targetIndex])
                                context.error_handler.AddMissingDependentProperty(properties_[targetIndex].name);
                        context.error_handler.EndMissingDependentProperties(source.name);
                    }
                    else if (source.dependenciesSchema) {
                        ISchemaValidator* dependenciesValidator = context.validators[source.dependenciesValidatorIndex];
                        if (!dependenciesValidator->IsValid())
                            context.error_handler.AddDependencySchemaError(source.name, dependenciesValidator);
                    }
                }
            }
            if (context.error_handler.EndDependencyErrors())
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorDependencies);
        }

        return true;
    }